

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O0

void __thiscall
embree::Instantiator::instantiate(Instantiator *this,Ref<embree::SceneGraph::GroupNode> *group)

{
  undefined1 *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  RefCount *pRVar4;
  undefined8 uVar5;
  int iVar6;
  element_type *peVar7;
  Ref<embree::SceneGraph::Node> RVar8;
  undefined8 *in_RSI;
  long in_RDI;
  float fVar9;
  float fVar10;
  AffineSpace3fa space;
  float angle;
  Vec2f p;
  Vec2f r;
  size_t i;
  __m128 r_2;
  __m128 a_1;
  __m128 r_1;
  __m128 a;
  Scalar c;
  Scalar s;
  Vector u;
  __m128 c_2;
  __m128 r_3;
  __m128 a_3;
  vfloat4 c_1;
  vfloat4 b;
  vfloat4 a_2;
  Ref<embree::SceneGraph::Node> *in_stack_ffffffffffffe640;
  GroupNode *this_00;
  Vec2f *in_stack_ffffffffffffe670;
  Distribution2D *in_stack_ffffffffffffe678;
  float local_1970;
  float local_194c;
  Ref<embree::SceneGraph::Node> local_1930;
  atomic<unsigned_long> local_1928;
  undefined1 auStack_1920 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  aStack_1910;
  ulong uStack_1900;
  undefined8 local_18f8;
  undefined8 in_stack_ffffffffffffe710;
  undefined8 in_stack_ffffffffffffe718;
  float fStack_18e0;
  float local_18d0;
  float local_18cc;
  undefined1 local_18c8 [16];
  undefined1 local_18b8 [16];
  undefined1 local_18a8 [16];
  Ref<embree::SceneGraph::Node> *in_stack_ffffffffffffe768;
  AffineSpace3fa *in_stack_ffffffffffffe770;
  TransformNode *this_01;
  size_t local_1878;
  pointer pfStack_1870;
  pointer local_1868;
  pointer pfStack_1860;
  pointer local_1858;
  pointer pfStack_1850;
  float local_1844;
  float local_1840;
  float local_183c;
  float local_1838;
  float local_1834;
  float local_1830;
  float local_182c;
  ulong local_1828;
  undefined8 *local_1820;
  undefined4 local_180c;
  undefined4 local_1808;
  undefined4 local_1804;
  atomic<unsigned_long> *local_1800;
  undefined8 local_17f8;
  undefined8 uStack_17f0;
  undefined4 local_17e8;
  undefined4 local_17e4;
  undefined4 local_17e0;
  undefined4 local_17dc;
  Ref<embree::SceneGraph::Node> *local_17d8;
  undefined8 local_17c8;
  undefined8 uStack_17c0;
  pointer local_17b8;
  pointer pfStack_17b0;
  TransformNode *local_17a8;
  undefined8 uStack_17a0;
  size_t local_1798;
  pointer pfStack_1790;
  pointer local_1788;
  pointer pfStack_1780;
  undefined1 *local_1770;
  undefined1 *local_1768;
  Distribution2D *local_1760;
  undefined8 *local_1758;
  Node *local_1750;
  GroupNode *local_1748;
  long local_1740;
  float *local_1738;
  float *local_1730;
  float *local_1728;
  undefined1 *local_1720;
  float *local_1718;
  float *local_1710;
  size_type local_1708;
  ulong uStack_1700;
  undefined8 local_16f8;
  ulong uStack_16f0;
  size_type local_16e8;
  Vec2f *pVStack_16e0;
  float *local_16d8;
  atomic<unsigned_long> *local_16d0;
  undefined1 *local_16c8;
  undefined1 *local_16c0;
  undefined8 *local_16b8;
  pointer *local_16b0;
  float local_16a8;
  float fStack_16a4;
  float fStack_16a0;
  float fStack_169c;
  pointer *local_1690;
  float local_1688;
  float fStack_1684;
  float fStack_1680;
  float fStack_167c;
  undefined8 local_1678;
  undefined8 uStack_1670;
  pointer local_1668;
  pointer pfStack_1660;
  size_t local_1658;
  pointer pfStack_1650;
  TransformNode *local_1648;
  undefined8 uStack_1640;
  undefined1 *local_1630;
  undefined1 *local_1628;
  TransformNode **local_1620;
  undefined8 local_1618;
  undefined8 uStack_1610;
  undefined8 local_1608;
  undefined8 uStack_1600;
  undefined8 local_15f8;
  undefined8 uStack_15f0;
  undefined8 local_15e8;
  undefined8 uStack_15e0;
  undefined8 local_15d8;
  undefined8 uStack_15d0;
  undefined8 *local_15c0;
  undefined1 *local_15b8;
  pointer *local_15b0;
  float local_15a4;
  undefined8 *local_15a0;
  float local_1594;
  undefined8 *local_1590;
  float local_1584;
  undefined8 *local_1580;
  undefined8 local_1578;
  undefined8 uStack_1570;
  undefined8 local_1568;
  undefined8 uStack_1560;
  undefined8 local_1558;
  undefined8 uStack_1550;
  undefined8 local_1548;
  undefined8 uStack_1540;
  undefined8 local_1538;
  undefined8 uStack_1530;
  char *local_1520;
  undefined1 *local_1518;
  size_t *local_1510;
  float local_1504;
  undefined8 *local_1500;
  float local_14f4;
  undefined8 *local_14f0;
  float local_14e4;
  undefined8 *local_14e0;
  undefined8 local_14d8;
  undefined8 uStack_14d0;
  undefined8 local_14c8;
  undefined8 uStack_14c0;
  undefined8 local_14b8;
  undefined8 uStack_14b0;
  undefined8 local_14a8;
  undefined8 uStack_14a0;
  undefined8 local_1498;
  undefined8 uStack_1490;
  undefined1 *local_1480;
  undefined1 *local_1478;
  TransformNode **local_1470;
  float local_1464;
  undefined8 *local_1460;
  float local_1454;
  undefined8 *local_1450;
  float local_1444;
  undefined8 *local_1440;
  undefined1 local_1438 [16];
  undefined8 local_1428;
  undefined8 uStack_1420;
  undefined8 local_1418;
  undefined8 uStack_1410;
  undefined8 local_1408;
  undefined8 uStack_1400;
  undefined8 local_13f8;
  undefined8 uStack_13f0;
  undefined1 *local_13e8;
  undefined1 *local_13e0;
  undefined8 *local_13d8;
  undefined4 local_13cc;
  undefined8 *local_13c8;
  undefined4 local_13bc;
  undefined8 *local_13b8;
  undefined1 *local_13a8;
  pointer *local_13a0;
  TransformNode **local_1398;
  Distribution2D *local_1390;
  pointer *local_1388;
  size_t *local_1380;
  TransformNode **local_1378;
  TransformNode **local_1370;
  pointer *local_1368;
  pointer *local_1360;
  size_t *local_1358;
  size_t *local_1350;
  TransformNode **local_1348;
  TransformNode **local_1340;
  pointer *local_1338;
  pointer *local_1330;
  undefined8 local_1328;
  undefined8 uStack_1320;
  undefined8 *local_1310;
  undefined1 *local_1308;
  undefined8 *local_1300;
  undefined8 *local_12f8;
  undefined8 *local_12f0;
  undefined8 *local_12e8;
  undefined8 *local_12e0;
  float local_12d8;
  float fStack_12d4;
  float fStack_12d0;
  float fStack_12cc;
  undefined8 *local_12c0;
  undefined8 local_12b8;
  undefined8 uStack_12b0;
  undefined8 local_12a8;
  undefined8 uStack_12a0;
  undefined8 local_1298;
  undefined8 uStack_1290;
  undefined8 *local_1280;
  undefined1 *local_1278;
  undefined8 *local_1270;
  undefined8 *local_1268;
  undefined8 *local_1260;
  undefined8 *local_1258;
  undefined8 *local_1250;
  float local_1248;
  float fStack_1244;
  float fStack_1240;
  float fStack_123c;
  undefined8 *local_1230;
  undefined8 local_1228;
  undefined8 uStack_1220;
  undefined8 local_1218;
  undefined8 uStack_1210;
  undefined8 local_1208;
  undefined8 uStack_1200;
  undefined8 *local_11f0;
  undefined1 *local_11e8;
  undefined8 *local_11e0;
  TransformNode **local_11d8;
  undefined8 *local_11d0;
  undefined8 *local_11c8;
  TransformNode **local_11c0;
  float local_11b8;
  float fStack_11b4;
  float fStack_11b0;
  float fStack_11ac;
  TransformNode **local_11a0;
  undefined8 local_1198;
  undefined8 uStack_1190;
  undefined8 local_1188;
  undefined8 uStack_1180;
  undefined8 local_1178;
  undefined8 uStack_1170;
  undefined8 *local_1160;
  undefined1 *local_1158;
  undefined8 *local_1150;
  undefined8 *local_1148;
  undefined8 *local_1140;
  undefined8 *local_1138;
  undefined8 *local_1130;
  float local_1128;
  float fStack_1124;
  float fStack_1120;
  float fStack_111c;
  undefined8 *local_1110;
  undefined8 local_1108;
  undefined8 uStack_1100;
  undefined8 local_10f8;
  undefined8 uStack_10f0;
  undefined8 local_10e8;
  undefined8 uStack_10e0;
  undefined8 *local_10d0;
  undefined1 *local_10c8;
  undefined8 *local_10c0;
  size_t *local_10b8;
  undefined8 *local_10b0;
  undefined8 *local_10a8;
  size_t *local_10a0;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  size_t *local_1080;
  undefined8 local_1078;
  undefined8 uStack_1070;
  undefined8 local_1068;
  undefined8 uStack_1060;
  undefined8 local_1058;
  undefined8 uStack_1050;
  undefined8 *local_1040;
  undefined1 *local_1038;
  undefined8 *local_1030;
  undefined8 *local_1028;
  undefined8 *local_1020;
  undefined8 *local_1018;
  undefined8 *local_1010;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  undefined8 *local_ff0;
  undefined8 local_fe8;
  undefined8 uStack_fe0;
  undefined8 local_fd8;
  undefined8 uStack_fd0;
  undefined8 local_fc8;
  undefined8 uStack_fc0;
  undefined8 *local_fb0;
  undefined1 *local_fa8;
  undefined8 *local_fa0;
  pointer *local_f98;
  undefined8 *local_f90;
  undefined8 *local_f88;
  pointer *local_f80;
  float local_f78;
  float fStack_f74;
  float fStack_f70;
  float fStack_f6c;
  pointer *local_f60;
  undefined8 local_f58;
  undefined8 uStack_f50;
  undefined8 local_f48;
  undefined8 uStack_f40;
  undefined8 local_f38;
  undefined8 uStack_f30;
  undefined8 *local_f20;
  undefined1 *local_f18;
  undefined8 *local_f10;
  undefined8 *local_f08;
  undefined8 *local_f00;
  undefined8 *local_ef8;
  undefined8 *local_ef0;
  float local_ee8;
  float fStack_ee4;
  float fStack_ee0;
  float fStack_edc;
  undefined8 *local_ed0;
  undefined8 local_ec8;
  undefined8 uStack_ec0;
  undefined8 local_eb8;
  undefined8 uStack_eb0;
  undefined1 *local_ea0;
  undefined8 *local_e98;
  undefined8 *local_e90;
  float local_e88;
  float fStack_e84;
  float fStack_e80;
  float fStack_e7c;
  undefined8 *local_e78;
  undefined1 *local_e70;
  undefined8 *local_e68;
  undefined8 *local_e60;
  float local_e58;
  float fStack_e54;
  float fStack_e50;
  float fStack_e4c;
  undefined8 *local_e48;
  undefined1 *local_e40;
  undefined8 *local_e38;
  undefined8 *local_e30;
  float local_e28;
  float fStack_e24;
  float fStack_e20;
  float fStack_e1c;
  undefined8 *local_e18;
  undefined1 *local_e10;
  undefined8 *local_e08;
  undefined8 *local_e00;
  float local_df8;
  float fStack_df4;
  float fStack_df0;
  float fStack_dec;
  undefined8 *local_de8;
  undefined1 *local_de0;
  undefined8 *local_dd8;
  undefined8 *local_dd0;
  float local_dc8;
  float fStack_dc4;
  float fStack_dc0;
  float fStack_dbc;
  undefined8 *local_db8;
  undefined1 *local_db0;
  undefined8 *local_da8;
  undefined8 *local_da0;
  float local_d98;
  float fStack_d94;
  float fStack_d90;
  float fStack_d8c;
  undefined8 *local_d88;
  undefined1 *local_d80;
  undefined8 *local_d78;
  undefined8 *local_d70;
  float local_d68;
  float fStack_d64;
  float fStack_d60;
  float fStack_d5c;
  undefined8 *local_d58;
  undefined1 *local_d50;
  undefined8 *local_d48;
  undefined8 *local_d40;
  float local_d38;
  float fStack_d34;
  float fStack_d30;
  float fStack_d2c;
  undefined8 *local_d28;
  undefined1 *local_d20;
  undefined1 *local_d18;
  undefined8 *local_d10;
  float local_d08;
  float fStack_d04;
  float fStack_d00;
  float fStack_cfc;
  undefined8 *local_cf8;
  undefined1 *local_cf0;
  undefined8 *local_ce8;
  undefined8 *local_ce0;
  float local_cd8;
  float fStack_cd4;
  float fStack_cd0;
  float fStack_ccc;
  undefined8 *local_cc8;
  undefined1 *local_cc0;
  undefined8 *local_cb8;
  undefined8 *local_cb0;
  float local_ca8;
  float fStack_ca4;
  float fStack_ca0;
  float fStack_c9c;
  undefined8 *local_c98;
  undefined1 *local_c90;
  undefined8 *local_c88;
  undefined8 *local_c80;
  float local_c78;
  float fStack_c74;
  float fStack_c70;
  float fStack_c6c;
  undefined8 *local_c60;
  undefined8 local_c48;
  undefined8 uStack_c40;
  undefined8 local_c28;
  undefined8 uStack_c20;
  float local_c18;
  float fStack_c14;
  float fStack_c10;
  float fStack_c0c;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  float local_b98;
  float fStack_b94;
  float fStack_b90;
  float fStack_b8c;
  undefined8 local_b88;
  undefined8 uStack_b80;
  float local_b78;
  float fStack_b74;
  float fStack_b70;
  float fStack_b6c;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined8 local_b48;
  undefined8 uStack_b40;
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined8 local_b08;
  undefined8 uStack_b00;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  TransformNode **local_ad0;
  Distribution2D *local_ac8;
  pointer *local_ac0;
  size_t *local_ab8;
  Distribution2D *local_ab0;
  pointer *local_aa8;
  pointer *local_aa0;
  size_t *local_a98;
  size_t *local_a90;
  TransformNode **local_a88;
  Distribution2D *local_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  size_type *local_a68;
  undefined1 *local_a60;
  undefined1 *local_a58;
  undefined8 *local_a50;
  undefined1 *local_a48;
  undefined1 *local_a40;
  undefined1 *local_a38;
  char *local_a30;
  undefined8 *local_a28;
  size_type *local_a20;
  undefined1 *local_a18;
  size_type *local_a10;
  undefined8 *local_a08;
  undefined8 *local_a00;
  char *local_9f8;
  size_type *local_9f0;
  undefined1 *local_9e8;
  undefined8 *local_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined4 local_9a8;
  undefined4 uStack_9a4;
  undefined4 uStack_9a0;
  undefined4 uStack_99c;
  undefined4 local_98c;
  undefined4 local_988;
  undefined4 uStack_984;
  undefined4 uStack_980;
  undefined4 uStack_97c;
  undefined4 local_96c;
  float local_968;
  float fStack_964;
  float fStack_960;
  float fStack_95c;
  float local_94c;
  float local_948;
  float fStack_944;
  float fStack_940;
  float fStack_93c;
  float local_92c;
  float local_928;
  float fStack_924;
  float fStack_920;
  float fStack_91c;
  float local_90c;
  float local_908;
  float fStack_904;
  float fStack_900;
  float fStack_8fc;
  float local_8ec;
  float local_8e8;
  float fStack_8e4;
  float fStack_8e0;
  float fStack_8dc;
  float local_8cc;
  float local_8c8;
  float fStack_8c4;
  float fStack_8c0;
  float fStack_8bc;
  float local_8ac;
  float local_8a8;
  float fStack_8a4;
  float fStack_8a0;
  float fStack_89c;
  float local_88c;
  float local_888;
  float fStack_884;
  float fStack_880;
  float fStack_87c;
  float local_86c;
  float local_868;
  float fStack_864;
  float fStack_860;
  float fStack_85c;
  float local_84c;
  undefined1 local_848 [16];
  ulong local_838;
  undefined8 uStack_830;
  float local_81c;
  undefined1 local_818 [16];
  ulong local_808;
  undefined8 uStack_800;
  float local_7ec;
  undefined1 local_7e8 [16];
  undefined4 local_7cc;
  undefined1 local_7c8 [16];
  float local_7ac;
  undefined1 local_7a8 [16];
  undefined4 local_78c;
  undefined1 local_788 [16];
  float local_76c;
  ulong local_768;
  undefined8 uStack_760;
  ulong local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  ulong local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  ulong local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  ulong local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  ulong local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  ulong local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  ulong local_678;
  undefined8 uStack_670;
  float local_664;
  float local_660;
  float local_65c;
  float local_658;
  float local_654;
  float local_650;
  float local_64c;
  float local_648;
  float local_644;
  float local_640;
  float local_63c;
  float local_638;
  float fStack_634;
  float fStack_630;
  float *local_628;
  atomic<unsigned_long> *local_620;
  size_type *local_618;
  float *local_610;
  float *local_608;
  float *local_600;
  float *local_5f8;
  float *local_5f0;
  float *local_5e8;
  float *local_5e0;
  float *local_5d8;
  float *local_5d0;
  size_type *local_5c8;
  float local_5bc;
  float local_5b8;
  float local_5b4;
  size_type *local_5b0;
  float local_5a4;
  float local_5a0;
  float local_59c;
  undefined8 *local_598;
  float local_58c;
  float local_588;
  float local_584;
  size_type *local_580;
  size_type local_578;
  Vec2f *pVStack_570;
  float local_568;
  float local_564;
  float local_560;
  undefined4 local_55c;
  undefined8 local_558;
  ulong uStack_550;
  float local_548;
  float local_544;
  float local_540;
  undefined4 local_53c;
  size_type local_538;
  ulong uStack_530;
  float local_520;
  float local_51c;
  float local_518;
  undefined4 local_514;
  atomic<unsigned_long> *local_510;
  float *local_508;
  float local_500;
  float local_4fc;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  float local_4e4;
  atomic<unsigned_long> *local_4e0;
  float *local_4d8;
  float local_4cc;
  undefined8 *local_4c8;
  undefined8 *local_4c0;
  atomic<unsigned_long> *local_4b8;
  float *local_4b0;
  float local_4a8;
  float fStack_4a4;
  float fStack_4a0;
  float fStack_49c;
  float *local_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  float local_468;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  float local_44c;
  ulong local_448;
  undefined8 uStack_440;
  undefined1 local_438 [16];
  undefined8 local_428;
  undefined8 uStack_420;
  undefined4 local_40c;
  undefined1 local_408 [16];
  undefined4 local_3ec;
  undefined1 local_3e8 [16];
  undefined4 local_3cc;
  undefined1 local_3c8 [16];
  undefined4 local_3ac;
  ulong local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  ulong local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  ulong local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  ulong local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  atomic<unsigned_long> *local_2e0;
  atomic<unsigned_long> *local_2d8;
  atomic<unsigned_long> *local_2d0;
  atomic<unsigned_long> *local_2c8;
  undefined8 *local_2c0;
  undefined4 local_2b8;
  undefined4 uStack_2b4;
  undefined4 uStack_2b0;
  undefined4 uStack_2ac;
  undefined8 *local_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  ulong local_268;
  undefined8 uStack_260;
  ulong local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 *local_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 *local_1c8;
  undefined8 *local_1c0;
  undefined8 *local_1b8;
  undefined8 *local_1b0;
  undefined8 *local_1a8;
  undefined8 *local_1a0;
  undefined8 *local_198;
  undefined8 *local_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined4 local_168;
  undefined4 uStack_164;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  undefined8 *local_158;
  undefined8 *local_150;
  undefined8 *local_148;
  undefined8 *local_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined4 local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined8 *local_108;
  undefined8 *local_100;
  undefined8 *local_f8;
  undefined8 *local_f0;
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 *local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 *local_a0;
  undefined8 *local_98;
  undefined8 *local_90;
  undefined8 *local_88;
  undefined8 *local_80;
  undefined8 *local_78;
  undefined8 *local_70;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 *local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 *local_20;
  
  local_1820 = in_RSI;
  for (local_1828 = 0; local_1828 < *(ulong *)(in_RDI + 0x30); local_1828 = local_1828 + 1) {
    iVar6 = rand();
    local_1834 = (float)iVar6 * 4.656613e-10;
    iVar6 = rand();
    local_1728 = &local_1830;
    local_1730 = &local_1834;
    local_1738 = &local_1838;
    local_1830 = local_1834;
    local_182c = local_1838;
    local_1838 = (float)iVar6 * 4.656613e-10;
    std::__shared_ptr_access<embree::Distribution2D,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<embree::Distribution2D,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x11dff6);
    Distribution2D::sample(in_stack_ffffffffffffe678,in_stack_ffffffffffffe670);
    peVar7 = std::
             __shared_ptr_access<embree::Distribution2D,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<embree::Distribution2D,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x11e01a);
    local_194c = (float)peVar7->width;
    local_7ec = local_194c;
    local_7ac = local_194c;
    local_7c8._4_4_ = 0;
    local_7c8._0_4_ = local_194c;
    local_808 = local_7c8._0_8_;
    uStack_800 = 0;
    local_768 = local_7c8._0_8_;
    uStack_760 = 0;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_7c8._0_8_;
    local_818 = rcpss(auVar2,auVar2);
    local_7cc = 0x40000000;
    local_7e8 = ZEXT416(0x40000000);
    local_708 = local_7c8._0_8_;
    uStack_700 = 0;
    local_6f8._0_4_ = local_818._0_4_;
    fVar10 = (float)local_6f8;
    local_6f8._4_4_ = local_818._4_4_;
    local_6f8._0_4_ = (float)local_6f8 * local_194c;
    uStack_6f0 = local_818._8_8_;
    local_6a8 = local_6f8;
    uStack_6a0 = local_818._8_8_;
    fVar9 = 2.0 - (float)local_6f8;
    local_698 = (ulong)(uint)fVar9;
    uStack_690 = 0;
    local_728 = local_698;
    uStack_720 = 0;
    fVar10 = fVar10 * fVar9;
    local_718 = CONCAT44(local_6f8._4_4_,fVar10);
    uStack_710 = local_818._8_8_;
    local_748 = local_718;
    uStack_740 = local_818._8_8_;
    local_1840 = local_1840 * fVar10;
    local_7c8 = ZEXT416((uint)local_194c);
    peVar7 = std::
             __shared_ptr_access<embree::Distribution2D,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<embree::Distribution2D,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x11e1c8);
    local_1970 = (float)peVar7->height;
    local_81c = local_1970;
    local_76c = local_1970;
    local_788._4_4_ = 0;
    local_788._0_4_ = local_1970;
    local_838 = local_788._0_8_;
    uStack_830 = 0;
    local_758 = local_788._0_8_;
    uStack_750 = 0;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_788._0_8_;
    local_848 = rcpss(auVar3,auVar3);
    local_78c = 0x40000000;
    local_7a8 = ZEXT416(0x40000000);
    local_6c8 = local_788._0_8_;
    uStack_6c0 = 0;
    local_6b8._0_4_ = local_848._0_4_;
    fVar10 = (float)local_6b8;
    local_6b8._4_4_ = local_848._4_4_;
    local_6b8._0_4_ = (float)local_6b8 * local_1970;
    uStack_6b0 = local_848._8_8_;
    local_688 = local_6b8;
    uStack_680 = local_848._8_8_;
    fVar9 = 2.0 - (float)local_6b8;
    local_678 = (ulong)(uint)fVar9;
    uStack_670 = 0;
    local_6e8 = local_678;
    uStack_6e0 = 0;
    fVar10 = fVar10 * fVar9;
    local_6d8 = CONCAT44(local_6b8._4_4_,fVar10);
    uStack_6d0 = local_848._8_8_;
    local_738 = local_6d8;
    uStack_730 = local_848._8_8_;
    local_183c = local_183c * fVar10;
    local_1720 = &pi;
    local_788 = ZEXT416((uint)local_1970);
    iVar6 = rand();
    local_1844 = (float)iVar6 * 4.656613e-10 * 6.2831855;
    local_1740 = in_RDI + 0x10;
    local_1710 = &local_18d0;
    local_18d0 = local_1840;
    local_18cc = local_183c;
    local_1718 = &local_1840;
    HeightField::get((HeightField *)in_stack_ffffffffffffe718,(Vec2f *)in_stack_ffffffffffffe710);
    local_1800 = &local_1928;
    local_1804 = 0;
    local_1808 = 0x3f800000;
    local_180c = 0;
    local_17dc = 0;
    local_17e0 = 0;
    local_17e4 = 0x3f800000;
    local_17e8 = 0;
    local_17f8 = 0x3f80000000000000;
    uStack_17f0 = 0;
    local_1928.super___atomic_base<unsigned_long>._M_i =
         (__atomic_base<unsigned_long>)0x3f80000000000000;
    auStack_1920._0_8_ = 0;
    puVar1 = auStack_1920 + 8;
    local_16d8 = &local_1844;
    local_508 = &local_638;
    local_2c0 = &local_2f8;
    local_288 = 0x3f80000000000000;
    uStack_280 = 0;
    local_298 = 0x3f80000000000000;
    uStack_290 = 0;
    local_2b8 = 0;
    uStack_2b4 = 0x3f800000;
    uStack_2b0 = 0;
    uStack_2ac = 0;
    local_1d8 = 0x3f80000000000000;
    uStack_1d0 = 0;
    local_1c8 = &local_208;
    local_1b8 = &local_218;
    local_138 = 0x3f8000003f800000;
    uStack_130 = 0x3f8000003f800000;
    local_1a8 = &local_228;
    local_188 = 0;
    uStack_180 = 0;
    local_198 = &local_248;
    local_118 = 0x3f800000;
    uStack_114 = 0x40000000;
    uStack_110 = 0x3f800000;
    uStack_10c = 0x3f800000;
    local_178 = 0x400000003f800000;
    uStack_170 = 0x3f8000003f800000;
    local_190 = &local_238;
    local_40c = 0x3f800000;
    uStack_164 = 0x40000000;
    uStack_160 = 0x3f800000;
    uStack_15c = 0x3f800000;
    local_1e8 = 0x400000003f800000;
    uStack_1e0 = 0x3f8000003f800000;
    local_3c8 = ZEXT416(0x3f800000);
    local_428 = 0x3f800000;
    uStack_420 = 0;
    local_278 = 0x3f800000;
    uStack_270 = 0;
    local_438 = rsqrtss(ZEXT816(0x3f800000),ZEXT816(0x3f800000));
    local_3cc = 0x3fc00000;
    local_3e8 = ZEXT416(0x3fc00000);
    local_318 = local_438._0_8_;
    uVar5 = local_318;
    uStack_310 = local_438._8_8_;
    local_318._0_4_ = local_438._0_4_;
    local_308 = (ulong)(uint)((float)local_318 * 1.5);
    uStack_300 = 0;
    local_3ec = 0xbf000000;
    local_408 = ZEXT416(0xbf000000);
    local_338 = local_408._0_8_;
    uStack_330 = 0;
    local_328 = 0xbf000000;
    uStack_320 = 0;
    local_358 = local_438._0_8_;
    uStack_350 = local_438._8_8_;
    local_348 = (ulong)(uint)((float)local_318 * -0.5);
    uStack_340 = 0;
    local_378 = local_438._0_8_;
    uStack_370 = local_438._8_8_;
    local_368 = CONCAT44(local_438._4_4_,(float)local_318 * (float)local_318);
    uStack_360 = local_438._8_8_;
    local_398 = local_368;
    uStack_390 = local_438._8_8_;
    local_4e4 = (float)local_318 * -0.5 * (float)local_318 * (float)local_318;
    local_388 = (ulong)(uint)local_4e4;
    uStack_380 = 0;
    local_268 = local_388;
    uStack_260 = 0;
    local_4e4 = (float)local_318 * 1.5 + local_4e4;
    local_258 = (ulong)(uint)local_4e4;
    uStack_250 = 0;
    local_448 = local_258;
    uStack_440 = 0;
    local_3a8 = local_258;
    uStack_3a0 = 0;
    local_4c8 = &local_4f8;
    local_488 = CONCAT44(local_4e4,local_4e4);
    uStack_480 = CONCAT44(local_4e4,local_4e4);
    local_478 = 0x3f80000000000000;
    uStack_470 = 0;
    local_638 = local_4e4 * 0.0;
    fStack_634 = local_4e4 * 1.0;
    fStack_630 = local_4e4 * 0.0;
    fStack_49c = local_4e4 * 0.0;
    local_500 = local_1844;
    local_16d0 = local_1800;
    local_16c8 = puVar1;
    local_628 = local_16d8;
    local_620 = local_1800;
    local_618 = &local_1708;
    local_510 = local_1800;
    local_4e0 = local_1800;
    local_4d8 = local_508;
    local_4cc = local_4e4;
    local_4c0 = local_4c8;
    local_4b8 = local_1800;
    local_4b0 = local_508;
    local_4a8 = local_638;
    fStack_4a4 = fStack_634;
    fStack_4a0 = fStack_630;
    local_490 = local_508;
    local_468 = local_4e4;
    fStack_464 = local_4e4;
    fStack_460 = local_4e4;
    fStack_45c = local_4e4;
    local_44c = local_4e4;
    local_3ac = local_40c;
    local_318 = uVar5;
    local_2e0 = local_1800;
    local_2d8 = local_1800;
    local_2d0 = local_1800;
    local_2c8 = local_1800;
    local_2a0 = local_2c0;
    local_1f0 = local_2c0;
    local_1c0 = local_1c8;
    local_1b0 = local_1c8;
    local_1a0 = local_1a8;
    local_168 = local_40c;
    local_158 = local_190;
    local_150 = local_1b8;
    local_148 = local_1c8;
    local_140 = local_198;
    local_128 = local_1d8;
    uStack_120 = uStack_1d0;
    local_108 = local_198;
    local_100 = local_190;
    local_f8 = local_1c8;
    local_f0 = local_1b8;
    local_e8 = uStack_2b4;
    uStack_e4 = uStack_2b4;
    uStack_e0 = uStack_2b4;
    uStack_dc = uStack_2b4;
    local_d8 = local_138;
    uStack_d0 = uStack_130;
    local_c0 = local_1b8;
    local_b8 = local_1d8;
    uStack_b0 = uStack_1d0;
    local_a0 = local_1c8;
    local_98 = local_1b8;
    local_90 = local_1c8;
    local_88 = local_1a8;
    local_80 = local_198;
    local_78 = local_1c8;
    local_70 = local_1a8;
    local_68 = uStack_2b0;
    uStack_64 = uStack_2b0;
    uStack_60 = uStack_2b0;
    uStack_5c = uStack_2b0;
    local_58 = local_188;
    uStack_50 = uStack_180;
    local_40 = local_1a8;
    local_38 = local_1d8;
    uStack_30 = uStack_1d0;
    local_20 = local_1c8;
    local_4f8 = local_488;
    uStack_4f0 = uStack_480;
    local_2f8 = local_1d8;
    uStack_2f0 = uStack_1d0;
    local_248 = local_178;
    uStack_240 = uStack_170;
    local_238 = local_1e8;
    uStack_230 = uStack_1e0;
    local_228 = local_188;
    uStack_220 = uStack_180;
    local_218 = local_138;
    uStack_210 = uStack_130;
    local_208 = local_1d8;
    uStack_200 = uStack_1d0;
    local_63c = sinf(local_1844);
    local_4fc = *local_628;
    local_640 = cosf(local_4fc);
    local_1464 = local_638 * local_638 + (1.0 - local_638 * local_638) * local_640;
    local_650 = local_638 * fStack_634 * (1.0 - local_640) + fStack_630 * local_63c;
    local_65c = local_638 * fStack_630 * (1.0 - local_640) - fStack_634 * local_63c;
    local_5d0 = &local_644;
    local_5d8 = &local_648;
    local_5e0 = &local_64c;
    local_5e8 = &local_650;
    local_5f0 = &local_654;
    local_5f8 = &local_658;
    local_600 = &local_65c;
    local_608 = &local_660;
    local_610 = &local_664;
    local_514 = 0;
    local_538 = CONCAT44(local_650,local_1464);
    uStack_530 = (ulong)(uint)local_65c;
    local_598 = &local_16f8;
    local_59c = local_648;
    local_5a0 = local_654;
    local_5a4 = local_660;
    local_53c = 0;
    local_558 = CONCAT44(local_654,local_648);
    uStack_550 = (ulong)(uint)local_660;
    local_580 = &local_16e8;
    local_584 = local_64c;
    local_588 = local_658;
    local_58c = local_664;
    local_55c = 0;
    local_578 = CONCAT44(local_658,local_64c);
    pVStack_570 = (Vec2f *)(ulong)(uint)local_664;
    local_a30 = aStack_1910._M_local_buf + 8;
    local_a28 = &local_18f8;
    local_a58 = &stack0xffffffffffffe718;
    local_a00 = &local_16f8;
    local_9f8 = aStack_1910._M_local_buf + 8;
    local_a10 = &local_16e8;
    local_a08 = &local_18f8;
    local_a50 = &local_a78;
    local_9d8 = 0;
    uStack_9d0 = 0;
    local_a78 = 0;
    uStack_a70 = 0;
    in_stack_ffffffffffffe718 = (HeightField *)0x0;
    in_stack_ffffffffffffe678 = (Distribution2D *)&stack0xffffffffffffe778;
    local_1620 = &local_17a8;
    local_1470 = &local_1648;
    local_1460 = &local_1498;
    local_b88 = CONCAT44(local_1464,local_1464);
    uStack_b80 = CONCAT44(local_1464,local_1464);
    local_1454 = (float)auStack_1920._12_4_;
    local_1450 = &local_14b8;
    local_b68 = CONCAT44(auStack_1920._12_4_,auStack_1920._12_4_);
    uStack_b60 = CONCAT44(auStack_1920._12_4_,auStack_1920._12_4_);
    local_1158 = local_18b8;
    local_1444 = (float)aStack_1910._M_allocated_capacity._0_4_;
    local_1440 = &local_14d8;
    local_c08 = CONCAT44(aStack_1910._M_allocated_capacity._0_4_,
                         aStack_1910._M_allocated_capacity._0_4_);
    uStack_c00 = CONCAT44(aStack_1910._M_allocated_capacity._0_4_,
                          aStack_1910._M_allocated_capacity._0_4_);
    local_cf0 = local_18a8;
    local_1160 = &local_14c8;
    local_c18 = (float)local_18a8._0_8_;
    fStack_c14 = SUB84(local_18a8._0_8_,4);
    fStack_c10 = (float)local_18a8._8_8_;
    fStack_c0c = SUB84(local_18a8._8_8_,4);
    local_cd8 = (float)aStack_1910._M_allocated_capacity._0_4_ * local_c18;
    fStack_cd4 = (float)aStack_1910._M_allocated_capacity._0_4_ * fStack_c14;
    fStack_cd0 = (float)aStack_1910._M_allocated_capacity._0_4_ * fStack_c10;
    fStack_ccc = (float)aStack_1910._M_allocated_capacity._0_4_ * fStack_c0c;
    local_11f0 = &local_14a8;
    local_1138 = &local_1178;
    local_b78 = (float)local_18b8._0_8_;
    fStack_b74 = SUB84(local_18b8._0_8_,4);
    fStack_b70 = (float)local_18b8._8_8_;
    fStack_b6c = SUB84(local_18b8._8_8_,4);
    local_dc8 = (float)auStack_1920._12_4_ * local_b78;
    fStack_dc4 = (float)auStack_1920._12_4_ * fStack_b74;
    fStack_dc0 = (float)auStack_1920._12_4_ * fStack_b70;
    fStack_dbc = (float)auStack_1920._12_4_ * fStack_b6c;
    local_10f8 = CONCAT44(fStack_dc4,local_dc8);
    uStack_10f0 = CONCAT44(fStack_dbc,fStack_dc0);
    local_1108._0_4_ = (float)local_14c8;
    local_1108._4_4_ = (float)((ulong)local_14c8 >> 0x20);
    uStack_1100._0_4_ = (float)uStack_14c0;
    uStack_1100._4_4_ = (float)((ulong)uStack_14c0 >> 0x20);
    local_1128 = local_dc8 + (float)local_1108;
    fStack_1124 = fStack_dc4 + local_1108._4_4_;
    fStack_1120 = fStack_dc0 + (float)uStack_1100;
    fStack_111c = fStack_dbc + uStack_1100._4_4_;
    local_11c8 = &local_1208;
    local_b98 = (float)local_18c8._0_8_;
    fStack_b94 = SUB84(local_18c8._0_8_,4);
    fStack_b90 = (float)local_18c8._8_8_;
    fStack_b8c = SUB84(local_18c8._8_8_,4);
    local_d98 = local_1464 * local_b98;
    fStack_d94 = local_1464 * fStack_b94;
    fStack_d90 = local_1464 * fStack_b90;
    fStack_d8c = local_1464 * fStack_b8c;
    local_1188 = CONCAT44(fStack_d94,local_d98);
    uStack_1180 = CONCAT44(fStack_d8c,fStack_d90);
    local_1198._0_4_ = (float)local_14a8;
    local_1198._4_4_ = (float)((ulong)local_14a8 >> 0x20);
    uStack_1190._0_4_ = (float)uStack_14a0;
    uStack_1190._4_4_ = (float)((ulong)uStack_14a0 >> 0x20);
    local_11b8 = local_d98 + (float)local_1198;
    fStack_11b4 = fStack_d94 + local_1198._4_4_;
    fStack_11b0 = fStack_d90 + (float)uStack_1190;
    fStack_11ac = fStack_d8c + uStack_1190._4_4_;
    this_01 = (TransformNode *)CONCAT44(fStack_11b4,local_11b8);
    uStack_17a0 = CONCAT44(fStack_11ac,fStack_11b0);
    local_1520 = aStack_1910._M_local_buf + 8;
    local_1510 = &local_1658;
    local_1504 = (float)aStack_1910._8_4_;
    local_1500 = &local_1538;
    local_b48 = CONCAT44(aStack_1910._8_4_,aStack_1910._8_4_);
    uStack_b40 = CONCAT44(aStack_1910._8_4_,aStack_1910._8_4_);
    local_14f4 = (float)aStack_1910._12_4_;
    local_14f0 = &local_1558;
    local_b28 = CONCAT44(aStack_1910._12_4_,aStack_1910._12_4_);
    uStack_b20 = CONCAT44(aStack_1910._12_4_,aStack_1910._12_4_);
    local_1038 = local_18b8;
    local_14e4 = (float)uStack_1900;
    local_14e0 = &local_1578;
    local_c28 = CONCAT44((float)uStack_1900,(float)uStack_1900);
    uStack_c20 = CONCAT44((float)uStack_1900,(float)uStack_1900);
    local_cc0 = local_18a8;
    local_1040 = &local_1568;
    local_ca8 = (float)uStack_1900 * local_c18;
    fStack_ca4 = (float)uStack_1900 * fStack_c14;
    fStack_ca0 = (float)uStack_1900 * fStack_c10;
    fStack_c9c = (float)uStack_1900 * fStack_c0c;
    local_10d0 = &local_1548;
    local_1018 = &local_1058;
    local_e28 = (float)aStack_1910._12_4_ * local_b78;
    fStack_e24 = (float)aStack_1910._12_4_ * fStack_b74;
    fStack_e20 = (float)aStack_1910._12_4_ * fStack_b70;
    fStack_e1c = (float)aStack_1910._12_4_ * fStack_b6c;
    local_fd8 = CONCAT44(fStack_e24,local_e28);
    uStack_fd0 = CONCAT44(fStack_e1c,fStack_e20);
    local_fe8._0_4_ = (float)local_1568;
    local_fe8._4_4_ = (float)((ulong)local_1568 >> 0x20);
    uStack_fe0._0_4_ = (float)uStack_1560;
    uStack_fe0._4_4_ = (float)((ulong)uStack_1560 >> 0x20);
    local_1008 = local_e28 + (float)local_fe8;
    fStack_1004 = fStack_e24 + local_fe8._4_4_;
    fStack_1000 = fStack_e20 + (float)uStack_fe0;
    fStack_ffc = fStack_e1c + uStack_fe0._4_4_;
    local_10a8 = &local_10e8;
    local_df8 = (float)aStack_1910._8_4_ * local_b98;
    fStack_df4 = (float)aStack_1910._8_4_ * fStack_b94;
    fStack_df0 = (float)aStack_1910._8_4_ * fStack_b90;
    fStack_dec = (float)aStack_1910._8_4_ * fStack_b8c;
    local_1068 = CONCAT44(fStack_df4,local_df8);
    uStack_1060 = CONCAT44(fStack_dec,fStack_df0);
    local_1078._0_4_ = (float)local_1548;
    local_1078._4_4_ = (float)((ulong)local_1548 >> 0x20);
    uStack_1070._0_4_ = (float)uStack_1540;
    uStack_1070._4_4_ = (float)((ulong)uStack_1540 >> 0x20);
    local_1098 = local_df8 + (float)local_1078;
    fStack_1094 = fStack_df4 + local_1078._4_4_;
    fStack_1090 = fStack_df0 + (float)uStack_1070;
    fStack_108c = fStack_dec + uStack_1070._4_4_;
    local_15c0 = &local_18f8;
    local_15b0 = &local_1668;
    local_15a4 = (float)local_18f8;
    local_15a0 = &local_15d8;
    local_b08 = CONCAT44((float)local_18f8,(float)local_18f8);
    uStack_b00 = CONCAT44((float)local_18f8,(float)local_18f8);
    local_1594 = local_18f8._4_4_;
    local_1590 = &local_15f8;
    local_ae8 = CONCAT44(local_18f8._4_4_,local_18f8._4_4_);
    uStack_ae0 = CONCAT44(local_18f8._4_4_,local_18f8._4_4_);
    local_f18 = local_18b8;
    local_1584 = SUB84(pVStack_16e0,0);
    local_1580 = &local_1618;
    local_c48 = CONCAT44(local_1584,local_1584);
    uStack_c40 = CONCAT44(local_1584,local_1584);
    local_c90 = local_18a8;
    local_f20 = &local_1608;
    local_c78 = local_1584 * local_c18;
    fStack_c74 = local_1584 * fStack_c14;
    fStack_c70 = local_1584 * fStack_c10;
    fStack_c6c = local_1584 * fStack_c0c;
    local_fb0 = &local_15e8;
    local_ef8 = &local_f38;
    local_e88 = local_18f8._4_4_ * local_b78;
    fStack_e84 = local_18f8._4_4_ * fStack_b74;
    fStack_e80 = local_18f8._4_4_ * fStack_b70;
    fStack_e7c = local_18f8._4_4_ * fStack_b6c;
    local_eb8 = CONCAT44(fStack_e84,local_e88);
    uStack_eb0 = CONCAT44(fStack_e7c,fStack_e80);
    local_ec8._0_4_ = (float)local_1608;
    local_ec8._4_4_ = (float)((ulong)local_1608 >> 0x20);
    uStack_ec0._0_4_ = (float)uStack_1600;
    uStack_ec0._4_4_ = (float)((ulong)uStack_1600 >> 0x20);
    local_ee8 = local_e88 + (float)local_ec8;
    fStack_ee4 = fStack_e84 + local_ec8._4_4_;
    fStack_ee0 = fStack_e80 + (float)uStack_ec0;
    fStack_edc = fStack_e7c + uStack_ec0._4_4_;
    local_f88 = &local_fc8;
    local_e58 = (float)local_18f8 * local_b98;
    fStack_e54 = (float)local_18f8 * fStack_b94;
    fStack_e50 = (float)local_18f8 * fStack_b90;
    fStack_e4c = (float)local_18f8 * fStack_b8c;
    local_f48 = CONCAT44(fStack_e54,local_e58);
    uStack_f40 = CONCAT44(fStack_e4c,fStack_e50);
    local_f58._0_4_ = (float)local_15e8;
    local_f58._4_4_ = (float)((ulong)local_15e8 >> 0x20);
    uStack_f50._0_4_ = (float)uStack_15e0;
    uStack_f50._4_4_ = (float)((ulong)uStack_15e0 >> 0x20);
    local_f78 = local_e58 + (float)local_f58;
    fStack_f74 = fStack_e54 + local_f58._4_4_;
    fStack_f70 = fStack_e50 + (float)uStack_f50;
    fStack_f6c = fStack_e4c + uStack_f50._4_4_;
    local_1350 = &local_1798;
    local_1360 = &local_1788;
    local_13e8 = &stack0xffffffffffffe718;
    local_16b8 = &local_17c8;
    local_13cc = 0;
    local_13c8 = &local_13f8;
    local_bc8 = 0;
    uStack_bc0 = 0;
    local_13bc = 0;
    local_13b8 = &local_1418;
    local_ba8 = 0;
    uStack_ba0 = 0;
    local_1278 = local_18b8;
    local_13a8 = local_1438;
    local_d20 = local_18a8;
    local_1280 = &local_1428;
    local_d08 = fStack_18e0 * local_c18;
    fStack_d04 = fStack_18e0 * fStack_c14;
    fStack_d00 = fStack_18e0 * fStack_c10;
    fStack_cfc = fStack_18e0 * fStack_c0c;
    local_1310 = &local_1408;
    local_1258 = &local_1298;
    local_d68 = local_b78 * 0.0;
    fStack_d64 = fStack_b74 * 0.0;
    fStack_d60 = fStack_b70 * 0.0;
    fStack_d5c = fStack_b6c * 0.0;
    local_1218 = CONCAT44(fStack_d64,local_d68);
    uStack_1210 = CONCAT44(fStack_d5c,fStack_d60);
    local_1228._0_4_ = (float)local_1428;
    local_1228._4_4_ = (float)((ulong)local_1428 >> 0x20);
    uStack_1220._0_4_ = (float)uStack_1420;
    uStack_1220._4_4_ = (float)((ulong)uStack_1420 >> 0x20);
    local_1248 = local_d68 + (float)local_1228;
    fStack_1244 = fStack_d64 + local_1228._4_4_;
    fStack_1240 = fStack_d60 + (float)uStack_1220;
    fStack_123c = fStack_d5c + uStack_1220._4_4_;
    local_12e8 = &local_1328;
    local_d38 = local_b98 * 0.0;
    fStack_d34 = fStack_b94 * 0.0;
    fStack_d30 = fStack_b90 * 0.0;
    fStack_d2c = fStack_b8c * 0.0;
    local_12a8 = CONCAT44(fStack_d34,local_d38);
    uStack_12a0 = CONCAT44(fStack_d2c,fStack_d30);
    local_12b8._0_4_ = (float)local_1408;
    local_12b8._4_4_ = (float)((ulong)local_1408 >> 0x20);
    uStack_12b0._0_4_ = (float)uStack_1400;
    uStack_12b0._4_4_ = (float)((ulong)uStack_1400 >> 0x20);
    local_12d8 = local_d38 + (float)local_12b8;
    fStack_12d4 = fStack_d34 + local_12b8._4_4_;
    fStack_12d0 = fStack_d30 + (float)uStack_12b0;
    fStack_12cc = fStack_d2c + uStack_12b0._4_4_;
    local_1678 = CONCAT44(fStack_12d4,local_12d8);
    uStack_1670 = CONCAT44(fStack_12cc,fStack_12d0);
    local_16c0 = &stack0xffffffffffffe768;
    local_16b0 = &local_17b8;
    local_1688 = SUB84(in_stack_ffffffffffffe768,0);
    fStack_1684 = (float)((ulong)in_stack_ffffffffffffe768 >> 0x20);
    fStack_1680 = SUB84(in_stack_ffffffffffffe770,0);
    fStack_167c = (float)((ulong)in_stack_ffffffffffffe770 >> 0x20);
    local_16a8 = local_12d8 + local_1688;
    fStack_16a4 = fStack_12d4 + fStack_1684;
    fStack_16a0 = fStack_12d0 + fStack_1680;
    fStack_169c = fStack_12cc + fStack_167c;
    local_ab8 = &local_1878;
    local_ac0 = &local_1868;
    local_a98 = &local_1798;
    local_1878 = local_1798;
    pfStack_1870 = pfStack_1790;
    local_aa8 = &local_1788;
    local_1868 = local_1788;
    pfStack_1860 = pfStack_1780;
    local_1330 = &local_1858;
    local_1858 = local_17b8;
    pfStack_1850 = pfStack_17b0;
    local_1758 = local_1820;
    in_stack_ffffffffffffe670 = (Vec2f *)*local_1820;
    in_stack_ffffffffffffe710 = pVStack_16e0;
    local_1770 = puVar1;
    local_1768 = local_18c8;
    local_1760 = in_stack_ffffffffffffe678;
    local_1690 = local_16b0;
    local_1630 = puVar1;
    local_1628 = local_18c8;
    local_15b8 = local_18c8;
    local_1518 = local_18c8;
    local_1480 = puVar1;
    local_1478 = local_18c8;
    local_13e0 = local_18c8;
    local_13d8 = local_16b8;
    local_13a0 = local_16b0;
    local_1398 = local_1620;
    local_1390 = in_stack_ffffffffffffe678;
    local_1388 = local_15b0;
    local_1380 = local_1510;
    local_1378 = local_1470;
    local_1370 = local_1620;
    local_1368 = local_15b0;
    local_1358 = local_1510;
    local_1348 = local_1470;
    local_1340 = local_1620;
    local_1338 = local_16b0;
    local_1308 = local_18c8;
    local_1300 = local_13c8;
    local_12f8 = local_16b8;
    local_12f0 = local_1310;
    local_12e0 = local_16b8;
    local_12c0 = local_16b8;
    local_12b8 = local_1408;
    uStack_12b0 = uStack_1400;
    local_1270 = local_13b8;
    local_1268 = local_1310;
    local_1260 = local_1280;
    local_1250 = local_1310;
    local_1230 = local_1310;
    local_1228 = local_1428;
    uStack_1220 = uStack_1420;
    local_11e8 = local_18c8;
    local_11e0 = local_1460;
    local_11d8 = local_1470;
    local_11d0 = local_11f0;
    local_11c0 = local_1470;
    local_11a0 = local_1470;
    local_1198 = local_14a8;
    uStack_1190 = uStack_14a0;
    local_1150 = local_1450;
    local_1148 = local_11f0;
    local_1140 = local_1160;
    local_1130 = local_11f0;
    local_1110 = local_11f0;
    local_1108 = local_14c8;
    uStack_1100 = uStack_14c0;
    local_10c8 = local_18c8;
    local_10c0 = local_1500;
    local_10b8 = local_1510;
    local_10b0 = local_10d0;
    local_10a0 = local_1510;
    local_1080 = local_1510;
    local_1078 = local_1548;
    uStack_1070 = uStack_1540;
    local_1030 = local_14f0;
    local_1028 = local_10d0;
    local_1020 = local_1040;
    local_1010 = local_10d0;
    local_ff0 = local_10d0;
    local_fe8 = local_1568;
    uStack_fe0 = uStack_1560;
    local_fa8 = local_18c8;
    local_fa0 = local_15a0;
    local_f98 = local_15b0;
    local_f90 = local_fb0;
    local_f80 = local_15b0;
    local_f60 = local_15b0;
    local_f58 = local_15e8;
    uStack_f50 = uStack_15e0;
    local_f10 = local_1590;
    local_f08 = local_fb0;
    local_f00 = local_f20;
    local_ef0 = local_fb0;
    local_ed0 = local_fb0;
    local_ec8 = local_1608;
    uStack_ec0 = uStack_1600;
    local_ea0 = local_f18;
    local_e98 = local_1590;
    local_e90 = local_ef8;
    local_e78 = local_ef8;
    local_e70 = local_18c8;
    local_e68 = local_15a0;
    local_e60 = local_f88;
    local_e48 = local_f88;
    local_e40 = local_1038;
    local_e38 = local_14f0;
    local_e30 = local_1018;
    local_e18 = local_1018;
    local_e10 = local_18c8;
    local_e08 = local_1500;
    local_e00 = local_10a8;
    local_de8 = local_10a8;
    local_de0 = local_1158;
    local_dd8 = local_1450;
    local_dd0 = local_1138;
    local_db8 = local_1138;
    local_db0 = local_18c8;
    local_da8 = local_1460;
    local_da0 = local_11c8;
    local_d88 = local_11c8;
    local_d80 = local_1278;
    local_d78 = local_13b8;
    local_d70 = local_1258;
    local_d58 = local_1258;
    local_d50 = local_18c8;
    local_d48 = local_13c8;
    local_d40 = local_12e8;
    local_d28 = local_12e8;
    local_d18 = local_13a8;
    local_d10 = local_1280;
    local_cf8 = local_1280;
    local_ce8 = local_1440;
    local_ce0 = local_1160;
    local_cc8 = local_1160;
    local_cb8 = local_14e0;
    local_cb0 = local_1040;
    local_c98 = local_1040;
    local_c88 = local_1580;
    local_c80 = local_f20;
    local_c60 = local_f20;
    local_ad0 = local_1620;
    local_ac8 = in_stack_ffffffffffffe678;
    local_ab0 = in_stack_ffffffffffffe678;
    local_aa0 = local_ac0;
    local_a90 = local_ab8;
    local_a88 = local_1620;
    local_a80 = in_stack_ffffffffffffe678;
    local_a68 = &local_1708;
    local_a60 = puVar1;
    local_a48 = local_a58;
    local_a40 = puVar1;
    local_a38 = puVar1;
    local_a20 = &local_1708;
    local_a18 = puVar1;
    local_9f0 = &local_1708;
    local_9e8 = puVar1;
    local_9e0 = local_a50;
    local_9a8 = local_13bc;
    uStack_9a4 = local_13bc;
    uStack_9a0 = local_13bc;
    uStack_99c = local_13bc;
    local_98c = local_13bc;
    local_988 = local_13cc;
    uStack_984 = local_13cc;
    uStack_980 = local_13cc;
    uStack_97c = local_13cc;
    local_96c = local_13cc;
    local_968 = local_1444;
    fStack_964 = local_1444;
    fStack_960 = local_1444;
    fStack_95c = local_1444;
    local_94c = local_1444;
    local_948 = local_1454;
    fStack_944 = local_1454;
    fStack_940 = local_1454;
    fStack_93c = local_1454;
    local_92c = local_1454;
    local_928 = local_1464;
    fStack_924 = local_1464;
    fStack_920 = local_1464;
    fStack_91c = local_1464;
    local_90c = local_1464;
    local_908 = local_14e4;
    fStack_904 = local_14e4;
    fStack_900 = local_14e4;
    fStack_8fc = local_14e4;
    local_8ec = local_14e4;
    local_8e8 = local_14f4;
    fStack_8e4 = local_14f4;
    fStack_8e0 = local_14f4;
    fStack_8dc = local_14f4;
    local_8cc = local_14f4;
    local_8c8 = local_1504;
    fStack_8c4 = local_1504;
    fStack_8c0 = local_1504;
    fStack_8bc = local_1504;
    local_8ac = local_1504;
    local_8a8 = local_1584;
    fStack_8a4 = local_1584;
    fStack_8a0 = local_1584;
    fStack_89c = local_1584;
    local_88c = local_1584;
    local_888 = local_1594;
    fStack_884 = local_1594;
    fStack_880 = local_1594;
    fStack_87c = local_1594;
    local_86c = local_1594;
    local_868 = local_15a4;
    fStack_864 = local_15a4;
    fStack_860 = local_15a4;
    fStack_85c = local_15a4;
    local_84c = local_15a4;
    local_664 = fStack_630 * fStack_630 + (1.0 - fStack_630 * fStack_630) * local_640;
    local_660 = fStack_634 * fStack_630 * (1.0 - local_640) + local_638 * local_63c;
    local_658 = fStack_634 * fStack_630 * (1.0 - local_640) - local_638 * local_63c;
    local_654 = fStack_634 * fStack_634 + (1.0 - fStack_634 * fStack_634) * local_640;
    local_64c = local_638 * fStack_630 * (1.0 - local_640) + fStack_634 * local_63c;
    local_648 = local_638 * fStack_634 * (1.0 - local_640) - fStack_630 * local_63c;
    local_644 = local_1464;
    local_5c8 = &local_1708;
    local_5bc = local_65c;
    local_5b8 = local_650;
    local_5b4 = local_1464;
    local_5b0 = &local_1708;
    local_568 = local_584;
    local_564 = local_588;
    local_560 = local_58c;
    local_548 = local_59c;
    local_544 = local_5a0;
    local_540 = local_5a4;
    local_520 = local_1464;
    local_51c = local_650;
    local_518 = local_65c;
    auStack_1920._8_8_ = local_538;
    aStack_1910._M_allocated_capacity = uStack_530;
    aStack_1910._8_8_ = local_16f8;
    uStack_1900 = uStack_16f0;
    local_18f8 = local_16e8;
    local_17c8 = local_1678;
    uStack_17c0 = uStack_1670;
    local_17b8 = (pointer)CONCAT44(fStack_16a4,local_16a8);
    pfStack_17b0 = (pointer)CONCAT44(fStack_169c,fStack_16a0);
    local_17a8 = this_01;
    local_1798 = local_1658;
    pfStack_1790 = pfStack_1650;
    local_1788 = local_1668;
    pfStack_1780 = pfStack_1660;
    local_1708 = local_538;
    uStack_1700 = uStack_530;
    local_16f8 = local_558;
    uStack_16f0 = uStack_550;
    local_16e8 = local_578;
    pVStack_16e0 = pVStack_570;
    local_1668 = (pointer)CONCAT44(fStack_f74,local_f78);
    pfStack_1660 = (pointer)CONCAT44(fStack_f6c,fStack_f70);
    local_1658 = CONCAT44(fStack_1094,local_1098);
    pfStack_1650 = (pointer)CONCAT44(fStack_108c,fStack_1090);
    local_1648 = this_01;
    uStack_1640 = uStack_17a0;
    local_1618 = local_c48;
    uStack_1610 = uStack_c40;
    local_1608 = CONCAT44(fStack_c74,local_c78);
    uStack_1600 = CONCAT44(fStack_c6c,fStack_c70);
    local_15f8 = local_ae8;
    uStack_15f0 = uStack_ae0;
    local_15e8 = CONCAT44(fStack_ee4,local_ee8);
    uStack_15e0 = CONCAT44(fStack_edc,fStack_ee0);
    local_15d8 = local_b08;
    uStack_15d0 = uStack_b00;
    local_1578 = local_c28;
    uStack_1570 = uStack_c20;
    local_1568 = CONCAT44(fStack_ca4,local_ca8);
    uStack_1560 = CONCAT44(fStack_c9c,fStack_ca0);
    local_1558 = local_b28;
    uStack_1550 = uStack_b20;
    local_1548 = CONCAT44(fStack_1004,local_1008);
    uStack_1540 = CONCAT44(fStack_ffc,fStack_1000);
    local_1538 = local_b48;
    uStack_1530 = uStack_b40;
    local_14d8 = local_c08;
    uStack_14d0 = uStack_c00;
    local_14c8 = CONCAT44(fStack_cd4,local_cd8);
    uStack_14c0 = CONCAT44(fStack_ccc,fStack_cd0);
    local_14b8 = local_b68;
    uStack_14b0 = uStack_b60;
    local_14a8 = CONCAT44(fStack_1124,local_1128);
    uStack_14a0 = CONCAT44(fStack_111c,fStack_1120);
    local_1498 = local_b88;
    uStack_1490 = uStack_b80;
    local_1428 = CONCAT44(fStack_d04,local_d08);
    uStack_1420 = CONCAT44(fStack_cfc,fStack_d00);
    local_1418 = local_ba8;
    uStack_1410 = uStack_ba0;
    local_1408 = CONCAT44(fStack_1244,local_1248);
    uStack_1400 = CONCAT44(fStack_123c,fStack_1240);
    local_13f8 = local_bc8;
    uStack_13f0 = uStack_bc0;
    local_1328 = local_12a8;
    uStack_1320 = uStack_12a0;
    local_1298 = local_1218;
    uStack_1290 = uStack_1210;
    local_1208 = local_1188;
    uStack_1200 = uStack_1180;
    local_1178 = local_10f8;
    uStack_1170 = uStack_10f0;
    local_10e8 = local_1068;
    uStack_10e0 = uStack_1060;
    local_1058 = local_fd8;
    uStack_1050 = uStack_fd0;
    local_fc8 = local_f48;
    uStack_fc0 = uStack_f40;
    local_f38 = local_eb8;
    uStack_f30 = uStack_eb0;
    RVar8.ptr = (Node *)SceneGraph::TransformNode::operator_new(0x120760);
    SceneGraph::TransformNode::TransformNode
              (this_01,in_stack_ffffffffffffe770,in_stack_ffffffffffffe768);
    this_00 = (GroupNode *)&local_1930;
    local_1750 = RVar8.ptr;
    local_1748 = this_00;
    if (RVar8.ptr != (Node *)0x0) {
      pRVar4 = &(local_1930.ptr)->super_RefCount;
      local_1930.ptr = RVar8.ptr;
      (*pRVar4->_vptr_RefCount[2])();
      RVar8.ptr = local_1930.ptr;
    }
    local_1930.ptr = RVar8.ptr;
    SceneGraph::GroupNode::add(this_00,in_stack_ffffffffffffe640);
    in_stack_ffffffffffffe640 = &local_1930;
    local_17d8 = in_stack_ffffffffffffe640;
    if (local_1930.ptr != (Node *)0x0) {
      (*((local_1930.ptr)->super_RefCount)._vptr_RefCount[3])();
    }
  }
  return;
}

Assistant:

void instantiate(Ref<SceneGraph::GroupNode>& group) 
    {
      for (size_t i=0; i<N; i++) 
      {
        Vec2f r = Vec2f(random<float>(),random<float>());
        Vec2f p = dist->sample(r);
        p.x *= rcp(float(dist->width)); p.y *= rcp(float(dist->height));
        float angle = 2.0f*float(pi)*random<float>();
        const AffineSpace3fa space = heightField->get(p)*AffineSpace3fa::rotate(Vec3fa(0,1,0),angle);
        group->add(new SceneGraph::TransformNode(space,object));
      }
    }